

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
splitFallback(HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
              *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar9;
  size_t lweight;
  size_t rweight;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar7 = uVar4 + uVar3 >> 1;
  lVar8 = uVar7 - uVar3;
  aVar12 = _DAT_01feba00;
  aVar13 = _DAT_01feb9f0;
  aVar14 = _DAT_01feba00;
  aVar15 = _DAT_01feb9f0;
  if (uVar7 < uVar3 || lVar8 == 0) {
    lweight = 0;
  }
  else {
    paVar9 = &this->prims0[uVar3].upper.field_0;
    lweight = 0;
    do {
      lweight = lweight + (paVar9[-1].field_1.field_3.u >> 0x1b);
      aVar1 = paVar9[-1].field_1;
      aVar2 = paVar9->field_1;
      aVar13.m128 = (__m128)minps(aVar13.m128,(undefined1  [16])aVar1);
      aVar12.m128 = (__m128)maxps(aVar12.m128,(undefined1  [16])aVar2);
      auVar16._0_4_ = aVar1.x + aVar2.x;
      auVar16._4_4_ = aVar1.y + aVar2.y;
      auVar16._8_4_ = aVar1.z + aVar2.z;
      auVar16._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      aVar15.m128 = (__m128)minps(aVar15.m128,auVar16);
      aVar14.m128 = (__m128)maxps(aVar14.m128,auVar16);
      paVar9 = paVar9 + 2;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  lVar8 = uVar4 - uVar7;
  aVar10 = _DAT_01feb9f0;
  aVar11 = _DAT_01feba00;
  aVar17 = _DAT_01feba00;
  aVar18 = _DAT_01feb9f0;
  if (uVar4 < uVar7 || lVar8 == 0) {
    rweight = 0;
  }
  else {
    paVar9 = &this->prims0[uVar7].upper.field_0;
    rweight = 0;
    do {
      rweight = rweight + (paVar9[-1].field_1.field_3.u >> 0x1b);
      aVar1 = paVar9[-1].field_1;
      aVar2 = paVar9->field_1;
      aVar18.m128 = (__m128)minps(aVar18.m128,(undefined1  [16])aVar1);
      aVar17.m128 = (__m128)maxps(aVar17.m128,(undefined1  [16])aVar2);
      fVar19 = aVar1.x + aVar2.x;
      fVar20 = aVar1.y + aVar2.y;
      fVar21 = aVar1.z + aVar2.z;
      fVar22 = aVar1.field_3.w + aVar2.field_3.w;
      auVar5._4_4_ = fVar20;
      auVar5._0_4_ = fVar19;
      auVar5._8_4_ = fVar21;
      auVar5._12_4_ = fVar22;
      aVar10.m128 = (__m128)minps(aVar10.m128,auVar5);
      auVar6._4_4_ = fVar20;
      auVar6._0_4_ = fVar19;
      auVar6._8_4_ = fVar21;
      auVar6._12_4_ = fVar22;
      aVar11.m128 = (__m128)maxps(aVar11.m128,auVar6);
      paVar9 = paVar9 + 2;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar13;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar12;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar15;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar14;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar3;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar7;
  (lset->super_extended_range<unsigned_long>)._ext_end = uVar7;
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar18;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar17;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar10;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar11;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar7;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar4;
  (rset->super_extended_range<unsigned_long>)._ext_end = uVar4;
  if ((set->super_extended_range<unsigned_long>)._ext_end !=
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) {
    setExtentedRanges(this,set,lset,rset,lweight,rweight);
    moveExtentedRange(this,set,lset,rset);
    return;
  }
  return;
}

Assistant:

void splitFallback(const PrimInfoExtRange& set, 
                           PrimInfoExtRange& lset, 
                           PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          const size_t center = (begin + end)/2;

          PrimInfo left(empty);
          for (size_t i=begin; i<center; i++) {
            left.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
          }
          const size_t lweight = left.end;
          
          PrimInfo right(empty);
          for (size_t i=center; i<end; i++) {
            right.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));	
          }
          const size_t rweight = right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          /* if we have an extended range */
          if (set.has_ext_range()) {
            setExtentedRanges(set,lset,rset,lweight,rweight);
            moveExtentedRange(set,lset,rset);
          }
        }